

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

void target_add_call_arg_op(c2m_ctx_t c2m_ctx,type *arg_type,target_arg_info_t *arg_info,op_t arg)

{
  gen_ctx_conflict *pgVar1;
  VARR_MIR_op_t *varr;
  undefined1 auVar2 [32];
  MIR_context_t ctx_00;
  MIR_type_t type_00;
  mir_size_t disp;
  undefined1 auVar3 [64];
  undefined1 in_stack_fffffffffffffee8 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  op_t mem;
  undefined1 auVar8 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  MIR_op_t local_b8;
  op_t local_88;
  int local_40;
  MIR_type_t local_3c;
  int n_qwords;
  MIR_type_t qword_types [2];
  MIR_type_t type;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  target_arg_info_t *arg_info_local;
  type *arg_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  unique0x00012000 = c2m_ctx->ctx;
  local_40 = process_aggregate_arg(c2m_ctx,arg_type,arg_info,&local_3c);
  if ((arg_type->mode == TM_STRUCT) || (arg_type->mode == TM_UNION)) {
    if ((arg.mir_op._8_2_ & 0xff) != 10) {
      __assert_fail("arg.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x192,
                    "void target_add_call_arg_op(c2m_ctx_t, struct type *, target_arg_info_t *, op_t)"
                   );
    }
    auVar3 = vmovdqu64_avx512f((undefined1  [64])arg);
    mem = (op_t)vmovdqu64_avx512f(auVar3);
    mem_to_address(&local_88,c2m_ctx,mem,1);
    auVar8 = mem._4_60_;
    memcpy(&arg,&local_88,0x40);
    type_00 = get_blk_type(local_40,&local_3c);
    ctx_00 = stack0xffffffffffffffd0;
    varr = pgVar1->call_ops;
    qword_types[0] = type_00;
    disp = type_size(c2m_ctx,arg_type);
    auVar3._4_60_ = auVar8;
    auVar3._0_4_ = 1;
    MIR_new_mem_op(&local_b8,ctx_00,type_00,disp,arg.mir_op.u.reg,0,'\x01');
    auVar6._0_16_ = auVar3._0_16_;
    auVar6._16_8_ = local_b8.u.i;
    auVar6._24_8_ = local_b8.u.str.s;
    auVar6._32_8_ = local_b8.u._16_8_;
    auVar6._48_16_ = auVar3._48_16_;
    auVar6._40_8_ = local_b8.u.mem.disp;
    auVar7._8_8_ = local_b8._8_8_;
    auVar7._0_8_ = local_b8.data;
    auVar7._16_8_ = local_b8.u.i;
    auVar7._32_32_ = auVar6._32_32_;
    auVar7._24_8_ = local_b8.u.str.s;
    VARR_MIR_op_tpush(varr,auVar7._0_48_);
  }
  else {
    qword_types[0] = get_mir_type(c2m_ctx,arg_type);
    auVar2 = (undefined1  [32])arg.mir_op._0_32_;
    auVar4._0_16_ = in_stack_fffffffffffffee8._0_16_;
    auVar4._16_8_ = arg.mir_op.u.i;
    auVar4._24_8_ = arg.mir_op.u.str.s;
    auVar4._32_8_ = arg.mir_op.u._16_8_;
    auVar4._48_16_ = in_stack_fffffffffffffee8._48_16_;
    auVar4._40_8_ = arg.mir_op.u.mem.disp;
    auVar5._32_32_ = auVar4._32_32_;
    auVar5._0_32_ = auVar2;
    VARR_MIR_op_tpush(pgVar1->call_ops,auVar5._0_48_);
    if ((qword_types[0] == MIR_T_F) || (qword_types[0] == MIR_T_D)) {
      arg_info->n_fregs = arg_info->n_fregs + 1;
    }
    else if (qword_types[0] != MIR_T_LD) {
      arg_info->n_iregs = arg_info->n_iregs + 1;
    }
  }
  return;
}

Assistant:

static void target_add_call_arg_op (c2m_ctx_t c2m_ctx, struct type *arg_type,
                                    target_arg_info_t *arg_info, op_t arg) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  int n_qwords = process_aggregate_arg (c2m_ctx, arg_type, arg_info, qword_types);

  /* pass aggregates on the stack and pass by value for others: */
  if (arg_type->mode != TM_STRUCT && arg_type->mode != TM_UNION) {
    type = get_mir_type (c2m_ctx, arg_type);
    VARR_PUSH (MIR_op_t, call_ops, arg.mir_op);
    if (type == MIR_T_F || type == MIR_T_D)
      arg_info->n_fregs++;
    else if (type != MIR_T_LD)
      arg_info->n_iregs++;
  } else {
    assert (arg.mir_op.mode == MIR_OP_MEM);
    arg = mem_to_address (c2m_ctx, arg, TRUE);
    type = get_blk_type (n_qwords, qword_types);
    VARR_PUSH (MIR_op_t, call_ops,
               MIR_new_mem_op (ctx, type, type_size (c2m_ctx, arg_type), arg.mir_op.u.reg, 0, 1));
  }
}